

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

uint32 leaf_mixw_occ(dtree_node_t *node,pset_t *pset,float32 ****mixw_occ,uint32 *node_id,
                    uint32 n_state,uint32 n_stream,uint32 n_density,uint32 off)

{
  uint32 off_00;
  uint local_44;
  uint local_40;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_stream_local;
  uint32 n_state_local;
  uint32 *node_id_local;
  float32 ****mixw_occ_local;
  pset_t *pset_local;
  dtree_node_t *node_local;
  
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    node_id[off] = node->node_id;
    for (k = 0; k < n_state; k = k + 1) {
      for (local_40 = 0; local_40 < n_stream; local_40 = local_40 + 1) {
        for (local_44 = 0; local_44 < n_density; local_44 = local_44 + 1) {
          mixw_occ[off][k][local_40][local_44] = node->mixw_occ[k][local_40][local_44];
        }
      }
    }
    node_local._4_4_ = off + 1;
  }
  else {
    off_00 = leaf_mixw_occ(node->y,pset,mixw_occ,node_id,n_state,n_stream,n_density,off);
    node_local._4_4_ =
         leaf_mixw_occ(node->n,pset,mixw_occ,node_id,n_state,n_stream,n_density,off_00);
  }
  return node_local._4_4_;
}

Assistant:

uint32
leaf_mixw_occ(dtree_node_t *node,
	      pset_t *pset,
	      float32 ****mixw_occ,
	      uint32 *node_id,
	      uint32 n_state,
	      uint32 n_stream,
	      uint32 n_density,
	      uint32 off)
{
    uint32 i, j, k;

    if (IS_LEAF(node)) {
	node_id[off] = node->node_id;

	for (i = 0; i < n_state; i++) {
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < n_density; k++) {
		    mixw_occ[off][i][j][k] = node->mixw_occ[i][j][k];
		}
	    }
	}

	return ++off;
    }
    else {
	off = leaf_mixw_occ(node->y,
			pset,
			mixw_occ,
			node_id,
			n_state,
			n_stream,
			n_density,
			off);
	off = leaf_mixw_occ(node->n,
			pset,
			mixw_occ,
			node_id,
			n_state,
			n_stream,
			n_density,
			off);
	return off;
    }
}